

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# belt_ecb.c
# Opt level: O0

void beltECBStepD(void *buf,size_t count,void *state)

{
  u32 *in_RDX;
  ulong in_RSI;
  octet *in_RDI;
  belt_ecb_st *st;
  ulong local_10;
  octet *local_8;
  
  local_8 = in_RDI;
  for (local_10 = in_RSI; 0xf < local_10; local_10 = local_10 - 0x10) {
    beltBlockDecr(local_8,in_RDX);
    local_8 = local_8 + 0x10;
  }
  if (local_10 != 0) {
    memSwap(local_8 + -0x10,local_8,local_10);
    beltBlockDecr(local_8 + -0x10,in_RDX);
  }
  return;
}

Assistant:

void beltECBStepD(void* buf, size_t count, void* state)
{
	belt_ecb_st* st = (belt_ecb_st*)state;
	ASSERT(count >= 16);
	ASSERT(memIsDisjoint2(buf, count, state, beltECB_keep()));
	// цикл по полным блокам
	while(count >= 16)
	{
		beltBlockDecr(buf, st->key);
		buf = (octet*)buf + 16;
		count -= 16;
	}
	// неполный блок? кража блока
	if (count)
	{
		memSwap((octet*)buf - 16, buf, count);
		beltBlockDecr((octet*)buf - 16, st->key);
	}
}